

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O1

void crnlib::rg_etc1::etc1_block::get_abs_subblock_colors
               (color_quad_u8 *pDst,uint16 packed_color4,uint table_idx)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  component_t cVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  
  uVar3 = (ulong)table_idx;
  uVar9 = packed_color4 >> 4 & 0xf;
  uVar7 = packed_color4 >> 8 & 0xf;
  uVar2 = (packed_color4 & 0xf) << 4 | packed_color4 & 0xf;
  uVar9 = uVar9 << 4 | uVar9;
  uVar7 = uVar7 << 4 | uVar7;
  iVar6 = (&g_etc1_inten_tables)[uVar3 * 4];
  iVar8 = 0;
  iVar5 = iVar6 + uVar7;
  if ((int)(iVar6 + uVar7) < 1) {
    iVar5 = iVar8;
  }
  cVar4 = (component_t)iVar5;
  if (0xfe < iVar5) {
    cVar4 = 0xff;
  }
  iVar5 = iVar6 + uVar9;
  if ((int)(iVar6 + uVar9) < 1) {
    iVar5 = iVar8;
  }
  if (0xfe < iVar5) {
    iVar5 = 0xff;
  }
  iVar10 = (&DAT_001bcc24)[uVar3 * 4];
  iVar1 = iVar6 + uVar2;
  if ((int)(iVar6 + uVar2) < 1) {
    iVar1 = iVar8;
  }
  (pDst->field_0).field_0.r = cVar4;
  if (0xfe < iVar1) {
    iVar1 = 0xff;
  }
  (pDst->field_0).field_0.g = (component_t)iVar5;
  (pDst->field_0).field_0.b = (component_t)iVar1;
  iVar6 = iVar10 + uVar7;
  if ((int)(iVar10 + uVar7) < 1) {
    iVar6 = iVar8;
  }
  if (0xfe < iVar6) {
    iVar6 = 0xff;
  }
  (pDst->field_0).field_0.a = 0xff;
  iVar5 = iVar10 + uVar9;
  if ((int)(iVar10 + uVar9) < 1) {
    iVar5 = iVar8;
  }
  pDst[1].field_0.field_0.r = (component_t)iVar6;
  cVar4 = (component_t)iVar5;
  if (0xfe < iVar5) {
    cVar4 = 0xff;
  }
  pDst[1].field_0.field_0.g = cVar4;
  iVar6 = iVar10 + uVar2;
  if ((int)(iVar10 + uVar2) < 1) {
    iVar6 = iVar8;
  }
  cVar4 = (component_t)iVar6;
  if (0xfe < iVar6) {
    cVar4 = 0xff;
  }
  pDst[1].field_0.field_0.b = cVar4;
  pDst[1].field_0.field_0.a = 0xff;
  iVar6 = *(int *)(&DAT_001bcc28 + uVar3 * 0x10);
  iVar5 = iVar6 + uVar7;
  if ((int)(iVar6 + uVar7) < 1) {
    iVar5 = iVar8;
  }
  if (0xfe < iVar5) {
    iVar5 = 0xff;
  }
  iVar10 = iVar6 + uVar9;
  if ((int)(iVar6 + uVar9) < 1) {
    iVar10 = iVar8;
  }
  pDst[2].field_0.field_0.r = (component_t)iVar5;
  cVar4 = (component_t)iVar10;
  if (0xfe < iVar10) {
    cVar4 = 0xff;
  }
  pDst[2].field_0.field_0.g = cVar4;
  iVar5 = iVar6 + uVar2;
  if ((int)(iVar6 + uVar2) < 1) {
    iVar5 = iVar8;
  }
  cVar4 = (component_t)iVar5;
  if (0xfe < iVar5) {
    cVar4 = 0xff;
  }
  pDst[2].field_0.field_0.b = cVar4;
  pDst[2].field_0.field_0.a = 0xff;
  iVar6 = *(int *)(&DAT_001bcc2c + uVar3 * 0x10);
  iVar5 = uVar7 + iVar6;
  if ((int)(uVar7 + iVar6) < 1) {
    iVar5 = iVar8;
  }
  cVar4 = (component_t)iVar5;
  if (0xfe < iVar5) {
    cVar4 = 0xff;
  }
  pDst[3].field_0.field_0.r = cVar4;
  iVar5 = uVar9 + iVar6;
  if ((int)(uVar9 + iVar6) < 1) {
    iVar5 = iVar8;
  }
  cVar4 = (component_t)iVar5;
  if (0xfe < iVar5) {
    cVar4 = 0xff;
  }
  pDst[3].field_0.field_0.g = cVar4;
  iVar5 = uVar2 + iVar6;
  if ((int)(uVar2 + iVar6) < 1) {
    iVar5 = iVar8;
  }
  cVar4 = (component_t)iVar5;
  if (0xfe < iVar5) {
    cVar4 = 0xff;
  }
  pDst[3].field_0.field_0.b = cVar4;
  pDst[3].field_0.field_0.a = 0xff;
  return;
}

Assistant:

void etc1_block::get_abs_subblock_colors(color_quad_u8* pDst, uint16 packed_color4, uint table_idx) {
  RG_ETC1_ASSERT(table_idx < cETC1IntenModifierValues);
  const int* pInten_modifer_table = &g_etc1_inten_tables[table_idx][0];

  uint r, g, b;
  unpack_color4(r, g, b, packed_color4, true);

  const int ir = static_cast<int>(r), ig = static_cast<int>(g), ib = static_cast<int>(b);

  const int y0 = pInten_modifer_table[0];
  pDst[0].set(ir + y0, ig + y0, ib + y0);

  const int y1 = pInten_modifer_table[1];
  pDst[1].set(ir + y1, ig + y1, ib + y1);

  const int y2 = pInten_modifer_table[2];
  pDst[2].set(ir + y2, ig + y2, ib + y2);

  const int y3 = pInten_modifer_table[3];
  pDst[3].set(ir + y3, ig + y3, ib + y3);
}